

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcrypt_pbkdf.c
# Opt level: O2

void bcrypt_hash(uint8_t *sha2pass,uint8_t *sha2salt,uint8_t *out)

{
  uint32_t *puVar1;
  uint8_t *data;
  uint8_t *data_00;
  uint32_t uVar2;
  uint16_t keybytes;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar3;
  undefined8 extraout_RDX_03;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  uint16_t j;
  uint16_t j_1;
  uint8_t *local_10f0;
  int local_10e4;
  uint32_t *local_10e0;
  uint32_t cdata [8];
  uint8_t ciphertext [32];
  blf_ctx state;
  
  builtin_memcpy(ciphertext + 0x10,"fishSwatDynamite",0x10);
  builtin_memcpy(ciphertext,"OxychromaticBlow",0x10);
  local_10f0 = sha2salt;
  memcpy(&state,Blowfish_initstate_initstate,0x1048);
  j_1 = 0;
  uVar3 = extraout_RDX;
  for (lVar7 = 0x400; data = local_10f0, lVar7 != 0x412; lVar7 = lVar7 + 1) {
    uVar2 = Blowfish_stream2word(sha2pass,0x40,&j_1);
    puVar1 = state.S[0] + lVar7;
    *puVar1 = *puVar1 ^ uVar2;
    uVar3 = extraout_RDX_00;
  }
  j_1 = 0;
  uVar4 = 0;
  uVar5 = 0;
  for (uVar8 = 0; data_00 = local_10f0, uVar8 < 0x12; uVar8 = uVar8 + 2) {
    uVar2 = Blowfish_stream2word(data,0x40,&j_1);
    cdata[0] = uVar2 ^ uVar4;
    uVar2 = Blowfish_stream2word(data,0x40,&j_1);
    _j = uVar2 ^ uVar5;
    Blowfish_encipher(&state,cdata,(uint32_t *)&j);
    state.P[uVar8] = cdata[0];
    state.P[uVar8 + 1] = _j;
    uVar3 = extraout_RDX_01;
    uVar4 = cdata[0];
    uVar5 = _j;
  }
  local_10e0 = state.S[0] + 1;
  local_10e4 = 0x40;
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    for (uVar8 = 0; uVar8 < 0x100; uVar8 = uVar8 + 2) {
      uVar2 = Blowfish_stream2word(data_00,0x40,&j_1);
      cdata[0] = uVar2 ^ uVar4;
      uVar2 = Blowfish_stream2word(data_00,0x40,&j_1);
      _j = uVar2 ^ uVar5;
      Blowfish_encipher(&state,cdata,(uint32_t *)&j);
      local_10e0[uVar8 - 1] = cdata[0];
      local_10e0[uVar8] = _j;
      uVar3 = extraout_RDX_02;
      uVar4 = cdata[0];
      uVar5 = _j;
    }
    local_10e0 = local_10e0 + 0x100;
  }
  while( true ) {
    bVar9 = local_10e4 == 0;
    local_10e4 = local_10e4 + -1;
    if (bVar9) break;
    Blowfish_expand0state(&state,local_10f0,(uint16_t)uVar3);
    Blowfish_expand0state(&state,sha2pass,keybytes);
    uVar3 = extraout_RDX_03;
  }
  _j = _j & 0xffff0000;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    uVar2 = Blowfish_stream2word(ciphertext,0x20,&j);
    cdata[lVar7] = uVar2;
  }
  for (iVar6 = 0; iVar6 != 0x40; iVar6 = iVar6 + 1) {
    for (lVar7 = 0; (short)lVar7 != 0x20; lVar7 = lVar7 + 8) {
      Blowfish_encipher(&state,(uint32_t *)((long)cdata + lVar7),
                        (uint32_t *)((long)cdata + lVar7 + 4));
    }
  }
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    *(uint32_t *)(out + lVar7 * 4) = cdata[lVar7];
  }
  explicit_bzero(ciphertext,0x20);
  explicit_bzero(cdata,0x20);
  explicit_bzero(&state,0x1048);
  return;
}

Assistant:

static void
bcrypt_hash(uint8_t *sha2pass, uint8_t *sha2salt, uint8_t *out)
{
    blf_ctx state;
    uint8_t ciphertext[BCRYPT_HASHSIZE] = {
        'O', 'x', 'y', 'c', 'h', 'r', 'o', 'm', 'a', 't', 'i', 'c',
        'B', 'l', 'o', 'w', 'f', 'i', 's', 'h',
        'S', 'w', 'a', 't',
        'D', 'y', 'n', 'a', 'm', 'i', 't', 'e' };
    uint32_t cdata[BCRYPT_BLOCKS];
    int i;
    uint16_t j;
    uint16_t shalen = SHA512_DIGEST_LENGTH;

    /* key expansion */
    Blowfish_initstate(&state);
    Blowfish_expandstate(&state, sha2salt, shalen, sha2pass, shalen);
    for(i = 0; i < 64; i++) {
        Blowfish_expand0state(&state, sha2salt, shalen);
        Blowfish_expand0state(&state, sha2pass, shalen);
    }

    /* encryption */
    j = 0;
    for(i = 0; i < BCRYPT_BLOCKS; i++)
        cdata[i] = Blowfish_stream2word(ciphertext, sizeof(ciphertext),
                                        &j);
    for(i = 0; i < 64; i++)
        blf_enc(&state, cdata, BCRYPT_BLOCKS / 2);

    /* copy out */
    for(i = 0; i < BCRYPT_BLOCKS; i++) {
        out[4 * i + 3] = (uint8_t)((cdata[i] >> 24) & 0xff);
        out[4 * i + 2] = (cdata[i] >> 16) & 0xff;
        out[4 * i + 1] = (cdata[i] >> 8) & 0xff;
        out[4 * i + 0] = cdata[i] & 0xff;
    }

    /* zap */
    _libssh2_explicit_zero(ciphertext, sizeof(ciphertext));
    _libssh2_explicit_zero(cdata, sizeof(cdata));
    _libssh2_explicit_zero(&state, sizeof(state));
}